

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_GetMass_Test<pica::Particle<(pica::Dimension)3>_>::TestBody
          (ParticleTest_GetMass_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertHelper *this_01;
  AssertionResult gtest_ar;
  ParticleType particle;
  double *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  Type in_stack_ffffffffffffff8c;
  AssertionResult local_60;
  Message *in_stack_ffffffffffffffb8;
  AssertHelper *in_stack_ffffffffffffffc0;
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *in_stack_ffffffffffffffe0;
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
            (in_stack_ffffffffffffffe0);
  pica::Constants<double>::electronMass();
  this_01 = (AssertHelper *)
            pica::Particle<(pica::Dimension)3>::getMass
                      ((Particle<(pica::Dimension)3> *)&stack0xffffffffffffffb0);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70,
             (double *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x2047b9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (this_01,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c
               ,in_stack_ffffffffffffff70);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x204807);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x204867);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetMass)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;

    ParticleType particle = this->randomParticle();
    ASSERT_EQ(pica::Constants<MassType>::electronMass(), particle.getMass());
}